

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsDemuxer.cpp
# Opt level: O3

void __thiscall
TSDemuxer::TSDemuxer(TSDemuxer *this,BufferedReaderManager *readManager,char *streamName)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  AbstractReader *pAVar3;
  undefined4 *puVar4;
  ostringstream ss;
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8;
  undefined7 uStack_1c7;
  undefined8 uStack_1c0;
  ostringstream local_1a8 [376];
  
  p_Var1 = &(this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header;
  (this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  (this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_AbstractDemuxer).m_fileBlockSize = 0x200000;
  (this->super_AbstractDemuxer).m_timeOffset = 0;
  (this->super_AbstractDemuxer)._vptr_AbstractDemuxer = (_func_int **)&PTR__TSDemuxer_0023f5c0;
  this->m_readManager = readManager;
  (this->m_streamName)._M_dataplus._M_p = (pointer)&(this->m_streamName).field_2;
  (this->m_streamName)._M_string_length = 0;
  (this->m_streamName).field_2._M_local_buf[0] = '\0';
  (this->m_streamNameLow)._M_dataplus._M_p = (pointer)&(this->m_streamNameLow).field_2;
  (this->m_streamNameLow)._M_string_length = 0;
  (this->m_streamNameLow).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->m_lastPesPts)._M_t._M_impl.super__Rb_tree_header;
  (this->m_lastPesPts)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_lastPesPts)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_lastPesPts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_lastPesPts)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_lastPesPts)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_lastPesDts)._M_t._M_impl.super__Rb_tree_header;
  (this->m_lastPesDts)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_lastPesDts)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_lastPesDts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_lastPesDts)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_lastPesDts)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header;
  (this->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_firstDtsTime)._M_t._M_impl.super__Rb_tree_header;
  (this->m_firstDtsTime)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_firstDtsTime)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_firstDtsTime)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_firstDtsTime)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_firstDtsTime)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_fullPtsTime)._M_t._M_impl.super__Rb_tree_header;
  (this->m_fullPtsTime)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_fullPtsTime)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_fullPtsTime)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_fullPtsTime)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_fullPtsTime)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_fullDtsTime)._M_t._M_impl.super__Rb_tree_header;
  (this->m_fullDtsTime)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_fullDtsTime)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_fullDtsTime)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_fullDtsTime)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_fullDtsTime)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_curPos = (uint8_t *)0x0;
  this->m_pmtPid = 0;
  this->m_codecReady = false;
  this->m_notificated = false;
  this->m_readCnt = 0;
  this->m_dataProcessed = 0;
  TS_program_map_section::TS_program_map_section(&this->m_pmt);
  memset(this->m_tmpBuffer,0,0xc0);
  (this->m_mplsInfo).super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_mplsInfo).super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_mplsInfo).super__Vector_base<MPLSPlayItem,_std::allocator<MPLSPlayItem>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_firstPCRTime = -1;
  pAVar3 = BufferedReaderManager::getReader(this->m_readManager,streamName);
  this->m_bufferedReader = pAVar3;
  iVar2 = (*pAVar3->_vptr_AbstractReader[6])(pAVar3);
  this->m_readerID = iVar2;
  if (this->m_bufferedReader != (AbstractReader *)0x0) {
    this->m_scale = 1;
    this->m_nptPos = 0;
    this->m_tmpBufferLen = 0;
    this->m_m2tsMode = false;
    this->m_lastReadRez = 0;
    this->m_m2tsHdrDiscarded = false;
    *(undefined4 *)&this->m_firstPTS = 0xffffffff;
    *(undefined4 *)((long)&this->m_firstPTS + 4) = 0xffffffff;
    *(undefined4 *)&this->m_lastPTS = 0xffffffff;
    *(undefined4 *)((long)&this->m_lastPTS + 4) = 0xffffffff;
    *(undefined4 *)&this->m_firstVideoPTS = 0xffffffff;
    *(undefined4 *)((long)&this->m_firstVideoPTS + 4) = 0xffffffff;
    *(undefined4 *)&this->m_lastVideoPTS = 0xffffffff;
    *(undefined4 *)((long)&this->m_lastVideoPTS + 4) = 0xffffffff;
    *(undefined4 *)&this->m_lastVideoDTS = 0xffffffff;
    *(undefined4 *)((long)&this->m_lastVideoDTS + 4) = 0xffffffff;
    *(undefined4 *)&this->m_videoDtsGap = 0xffffffff;
    *(undefined4 *)((long)&this->m_videoDtsGap + 4) = 0xffffffff;
    this->m_firstCall = true;
    this->m_prevFileLen = 0;
    this->m_curFileNum = 0;
    this->m_lastPCRVal = -1;
    this->m_nonMVCVideoFound = false;
    this->m_firstDemuxCall = true;
    memset(this->m_acceptedPidCache,0,0x2000);
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "TS demuxer can\'t accept reader because this reader does not support BufferedReader interface"
             ,0x5c);
  puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar4 = 3;
  *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
  if (local_1d8 == &local_1c8) {
    *(ulong *)(puVar4 + 6) = CONCAT71(uStack_1c7,local_1c8);
    *(undefined8 *)(puVar4 + 8) = uStack_1c0;
  }
  else {
    *(undefined1 **)(puVar4 + 2) = local_1d8;
    *(ulong *)(puVar4 + 6) = CONCAT71(uStack_1c7,local_1c8);
  }
  *(undefined8 *)(puVar4 + 4) = local_1d0;
  local_1c8 = 0;
  __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

TSDemuxer::TSDemuxer(const BufferedReaderManager& readManager, const char* streamName)
    : m_readManager(readManager),
      m_curPos(nullptr),
      m_pmtPid(0),
      m_codecReady(false),
      m_readCnt(0),
      m_dataProcessed(0),
      m_notificated(false),
      m_tmpBuffer{}
{
    m_firstPCRTime = -1;
    m_bufferedReader = m_readManager.getReader(streamName);
    m_readerID = m_bufferedReader->createReader(TS_FRAME_SIZE);
    if (m_bufferedReader == nullptr)
        THROW(ERR_COMMON,
              "TS demuxer can't accept reader because this reader does not support BufferedReader interface")
    m_scale = 1;
    m_nptPos = 0;
    m_tmpBufferLen = 0;
    m_m2tsMode = false;
    m_lastReadRez = 0;
    m_m2tsHdrDiscarded = false;
    m_firstPTS = -1;
    m_lastPTS = -1;
    m_firstVideoPTS = -1;
    m_lastVideoPTS = -1;
    m_lastVideoDTS = -1;
    m_videoDtsGap = -1;
    m_firstCall = true;
    m_prevFileLen = 0;
    m_curFileNum = 0;
    m_lastPCRVal = -1;
    m_nonMVCVideoFound = false;
    m_firstDemuxCall = true;
    memset(m_acceptedPidCache, 0, sizeof(m_acceptedPidCache));
}